

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

JavascriptPromiseReactionTaskFunction * __thiscall
Js::JavascriptLibrary::CreatePromiseReactionTaskFunction
          (JavascriptLibrary *this,JavascriptMethod entryPoint,JavascriptPromiseReaction *reaction,
          Var argument)

{
  Recycler *pRVar1;
  FunctionInfo *this_00;
  JavascriptPromiseReactionTaskFunction *this_01;
  InfoBitsWrapper<(Memory::ObjectInfoBits)1> local_99;
  TrackAllocData local_98;
  DynamicType *local_70;
  DynamicType *type;
  undefined8 local_60;
  TrackAllocData local_58;
  FunctionInfo *local_30;
  FunctionInfo *functionInfo;
  Var argument_local;
  JavascriptPromiseReaction *reaction_local;
  JavascriptMethod entryPoint_local;
  JavascriptLibrary *this_local;
  
  functionInfo = (FunctionInfo *)argument;
  argument_local = reaction;
  reaction_local = (JavascriptPromiseReaction *)entryPoint;
  entryPoint_local = (JavascriptMethod)this;
  pRVar1 = GetRecycler(this);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_58,(type_info *)&FunctionInfo::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
             ,0x19eb);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_58);
  type = (DynamicType *)Memory::Recycler::AllocInlined;
  local_60 = 0;
  this_00 = (FunctionInfo *)new<Memory::Recycler>(0x20,pRVar1,0x43c4b0);
  FunctionInfo::FunctionInfo
            (this_00,(JavascriptMethod)reaction_local,ErrorOnNew,0xffffffff,(FunctionProxy *)0x0);
  local_30 = this_00;
  local_70 = CreateDeferredPrototypeFunctionType(this,(JavascriptMethod)reaction_local);
  pRVar1 = GetRecycler(this);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_98,(type_info *)&JavascriptPromiseReactionTaskFunction::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
             ,0x19ee);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_98);
  this_01 = (JavascriptPromiseReactionTaskFunction *)
            new<(Memory::ObjectInfoBits)1>(0x50,pRVar1,&local_99);
  JavascriptPromiseReactionTaskFunction::JavascriptPromiseReactionTaskFunction
            (this_01,local_70,local_30,(JavascriptPromiseReaction *)argument_local,functionInfo);
  return this_01;
}

Assistant:

JavascriptPromiseReactionTaskFunction* JavascriptLibrary::CreatePromiseReactionTaskFunction(JavascriptMethod entryPoint, JavascriptPromiseReaction* reaction, Var argument)
    {
        FunctionInfo* functionInfo = RecyclerNew(this->GetRecycler(), FunctionInfo, entryPoint, FunctionInfo::Attributes::ErrorOnNew);
        DynamicType* type = CreateDeferredPrototypeFunctionType(entryPoint);

        return RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, JavascriptPromiseReactionTaskFunction, type, functionInfo, reaction, argument);
    }